

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int read32bits(sqlite3_file *fd,i64 offset,u32 *pRes)

{
  int iVar1;
  u32 uVar2;
  u8 local_24 [4];
  int rc;
  uchar ac [4];
  u32 *pRes_local;
  i64 offset_local;
  sqlite3_file *fd_local;
  
  _rc = pRes;
  iVar1 = sqlite3OsRead(fd,local_24,4,offset);
  if (iVar1 == 0) {
    uVar2 = sqlite3Get4byte(local_24);
    *_rc = uVar2;
  }
  return iVar1;
}

Assistant:

static int read32bits(sqlite3_file *fd, i64 offset, u32 *pRes){
  unsigned char ac[4];
  int rc = sqlite3OsRead(fd, ac, sizeof(ac), offset);
  if( rc==SQLITE_OK ){
    *pRes = sqlite3Get4byte(ac);
  }
  return rc;
}